

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

ostream * Catch::TextFlow::operator<<(ostream *os,Column *col)

{
  bool bVar1;
  bool bVar2;
  undefined1 local_98 [8];
  string line;
  iterator __end2;
  iterator __begin2;
  Column *__range2;
  bool first;
  Column *col_local;
  ostream *os_local;
  
  bVar1 = true;
  Column::begin((iterator *)&__end2.m_suffix,col);
  Column::end((iterator *)((long)&line.field_2 + 8),col);
  while( true ) {
    bVar2 = Column::iterator::operator!=
                      ((iterator *)&__end2.m_suffix,(iterator *)((long)&line.field_2 + 8));
    if (!bVar2) break;
    Column::iterator::operator*[abi_cxx11_((string *)local_98,(iterator *)&__end2.m_suffix);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      std::operator<<(os,'\n');
    }
    std::operator<<(os,(string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
    Column::iterator::operator++((iterator *)&__end2.m_suffix);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, Column const &col) {
            bool first = true;
            for (auto line : col) {
                if (first) {
                    first = false;
                }
                else {
                    os << '\n';
                }
                os << line;
            }
            return os;
        }